

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O3

int32_t uprv_stableBinarySearch_63
                  (char *array,int32_t limit,void *item,int32_t itemSize,UComparator *cmp,
                  void *context)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  
  bVar1 = false;
  if (limit < 9) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    bVar1 = false;
    do {
      uVar5 = (int)(limit + uVar3) / 2;
      iVar2 = (*cmp)(context,item,array + (int)(uVar5 * itemSize));
      uVar4 = uVar5;
      if (-1 < iVar2) {
        uVar4 = limit;
        uVar3 = uVar5;
      }
      if (iVar2 == 0) {
        bVar1 = true;
        uVar4 = limit;
        uVar3 = uVar5 + 1;
      }
      limit = uVar4;
    } while (8 < (int)(limit - uVar3));
  }
  uVar4 = uVar3;
  if ((int)uVar3 < limit) {
    pcVar6 = array + (long)(int)uVar3 * (long)itemSize;
    do {
      iVar2 = (*cmp)(context,item,pcVar6);
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        uVar4 = uVar3;
        if (iVar2 < 0) break;
      }
      uVar3 = uVar3 + 1;
      pcVar6 = pcVar6 + itemSize;
      uVar4 = limit;
    } while (limit != uVar3);
  }
  uVar3 = ~uVar4;
  if (bVar1) {
    uVar3 = uVar4 - 1;
  }
  return uVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_stableBinarySearch(char *array, int32_t limit, void *item, int32_t itemSize,
                        UComparator *cmp, const void *context) {
    int32_t start=0;
    UBool found=FALSE;

    /* Binary search until we get down to a tiny sub-array. */
    while((limit-start)>=MIN_QSORT) {
        int32_t i=(start+limit)/2;
        int32_t diff=cmp(context, item, array+i*itemSize);
        if(diff==0) {
            /*
             * Found the item. We look for the *last* occurrence of such
             * an item, for stable sorting.
             * If we knew that there will be only few equal items,
             * we could break now and enter the linear search.
             * However, if there are many equal items, then it should be
             * faster to continue with the binary search.
             * It seems likely that we either have all unique items
             * (where found will never become TRUE in the insertion sort)
             * or potentially many duplicates.
             */
            found=TRUE;
            start=i+1;
        } else if(diff<0) {
            limit=i;
        } else {
            start=i;
        }
    }

    /* Linear search over the remaining tiny sub-array. */
    while(start<limit) {
        int32_t diff=cmp(context, item, array+start*itemSize);
        if(diff==0) {
            found=TRUE;
        } else if(diff<0) {
            break;
        }
        ++start;
    }
    return found ? (start-1) : ~start;
}